

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_last_segment(void)

{
  pointer *this;
  initializer_list<int> input;
  pointer first_begin;
  pointer ptVar1;
  size_type sVar2;
  iterator second_begin;
  iterator second_end;
  undefined1 auStack_78 [8];
  vector<int,_std::allocator<int>_> expect;
  segment segment;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  segment.member.tail._0_4_ = 0xb;
  segment.member.tail._4_4_ = 0x16;
  input._M_len = 2;
  input._M_array = (iterator)&segment.member.tail;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  join_0x00000010_0x00000000_ =
       (member_storage<int,_18446744073709551615UL>)
       vista::circular_view<int,_18446744073709551615UL>::last_segment
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  auStack_78 = (undefined1  [8])0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)auStack_78);
  this = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  first_begin = vista::span<int,_18446744073709551615UL>::data
                          ((span<int,_18446744073709551615UL> *)this);
  ptVar1 = vista::span<int,_18446744073709551615UL>::data((span<int,_18446744073709551615UL> *)this)
  ;
  sVar2 = vista::span<int,_18446744073709551615UL>::size((span<int,_18446744073709551615UL> *)this);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)auStack_78);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)auStack_78);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x217,"void api_dynamic_suite::dynamic_last_segment()",first_begin,ptVar1 + sVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)auStack_78);
  return;
}

Assistant:

void dynamic_last_segment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22 };
    auto segment = span.last_segment();
    {
        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}